

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O1

void inproc_conn_finish(nni_aio *aio,int rv,inproc_ep *ep,inproc_pipe *pipe)

{
  int iVar1;
  
  nni_aio_list_remove(aio);
  if (ep->listener == (nni_listener *)0x0) {
    iVar1 = nni_list_empty(&ep->aios);
    if (iVar1 != 0) {
      nni_list_node_remove(&ep->node);
    }
  }
  if (rv != 0) {
    if (pipe != (inproc_pipe *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/inproc/inproc.c"
                ,0x13f,"pipe == NULL");
    }
    nni_aio_finish_error(aio,rv);
    return;
  }
  nni_aio_set_output(aio,0,pipe->pipe);
  nni_aio_finish(aio,NNG_OK,0);
  return;
}

Assistant:

static void
inproc_conn_finish(nni_aio *aio, int rv, inproc_ep *ep, inproc_pipe *pipe)
{
	nni_aio_list_remove(aio);

	if ((ep->listener == NULL) && nni_list_empty(&ep->aios)) {
		nni_list_node_remove(&ep->node);
	}

	if (rv == 0) {
		nni_aio_set_output(aio, 0, pipe->pipe);
		nni_aio_finish(aio, 0, 0);
	} else {
		NNI_ASSERT(pipe == NULL);
		nni_aio_finish_error(aio, rv);
	}
}